

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O0

void __thiscall hwnet::TCPConnector::OnActive(TCPConnector *this,int _)

{
  Poller *pPVar1;
  bool bVar2;
  element_type *this_00;
  enable_shared_from_this<hwnet::TCPConnector> local_80;
  shared_ptr<hwnet::Task> local_70;
  byte local_59;
  undefined1 local_58 [7];
  bool post;
  shared_ptr<hwnet::util::Timer> p;
  enable_shared_from_this<hwnet::TCPConnector> local_38;
  shared_ptr<hwnet::Channel> local_28;
  int local_14;
  TCPConnector *pTStack_10;
  int __local;
  TCPConnector *this_local;
  
  local_14 = _;
  pTStack_10 = this;
  bVar2 = checkError(this);
  this->gotError = bVar2;
  pPVar1 = this->poller_;
  std::enable_shared_from_this<hwnet::TCPConnector>::shared_from_this(&local_38);
  std::shared_ptr<hwnet::Channel>::shared_ptr<hwnet::TCPConnector,void>
            (&local_28,(shared_ptr<hwnet::TCPConnector> *)&local_38);
  Poller::Remove(pPVar1,&local_28);
  std::shared_ptr<hwnet::Channel>::~shared_ptr(&local_28);
  std::shared_ptr<hwnet::TCPConnector>::~shared_ptr((shared_ptr<hwnet::TCPConnector> *)&local_38);
  std::weak_ptr<hwnet::util::Timer>::lock((weak_ptr<hwnet::util::Timer> *)local_58);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
  if (bVar2) {
    this_00 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_58);
    util::Timer::cancel(this_00);
    std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->connectTimer).
                super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::shared_ptr<hwnet::util::Timer>::~shared_ptr((shared_ptr<hwnet::util::Timer> *)local_58);
  local_59 = 0;
  std::mutex::lock(&this->mtx);
  if ((this->doing & 1U) == 0) {
    local_59 = 1;
    this->doing = true;
  }
  std::mutex::unlock(&this->mtx);
  if ((local_59 & 1) != 0) {
    pPVar1 = this->poller_;
    std::enable_shared_from_this<hwnet::TCPConnector>::shared_from_this(&local_80);
    std::shared_ptr<hwnet::Task>::shared_ptr<hwnet::TCPConnector,void>
              (&local_70,(shared_ptr<hwnet::TCPConnector> *)&local_80);
    Poller::PostTask(pPVar1,&local_70,(ThreadPool *)0x0);
    std::shared_ptr<hwnet::Task>::~shared_ptr(&local_70);
    std::shared_ptr<hwnet::TCPConnector>::~shared_ptr((shared_ptr<hwnet::TCPConnector> *)&local_80);
  }
  return;
}

Assistant:

void TCPConnector::OnActive(int _) {
	(void)_;	

	this->gotError = this->checkError();

	this->poller_->Remove(shared_from_this());

	
	if(auto p = this->connectTimer.lock()) {
		p->cancel();
		this->connectTimer.reset();
	}
	
	auto post = false;
	this->mtx.lock();
	if(!this->doing) {
		post = true;
		this->doing = true;
	}
	this->mtx.unlock();

	if(post) {
		poller_->PostTask(shared_from_this());
	}
}